

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O1

exr_result_t unpack_16bit_3chan(exr_decode_pipeline_t *decode)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  exr_coding_channel_info_t *peVar8;
  void *pvVar9;
  int iVar10;
  ulong uVar11;
  int y;
  int iVar12;
  uint8_t *puVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  uint8_t *puVar17;
  ulong uVar18;
  uint8_t *puVar19;
  uint8_t *puVar20;
  long lVar21;
  
  iVar10 = (decode->chunk).height - decode->user_line_end_ignore;
  iVar12 = decode->user_line_begin_skip;
  if (iVar12 < iVar10) {
    peVar8 = decode->channels;
    uVar1 = peVar8->width;
    iVar2 = peVar8[2].user_pixel_stride;
    iVar3 = peVar8[1].user_pixel_stride;
    iVar4 = peVar8->user_pixel_stride;
    pvVar9 = decode->unpacked_buffer;
    lVar15 = (long)(int)(uVar1 * 6);
    lVar21 = (long)(int)(uVar1 * 6 * iVar12);
    lVar16 = (long)pvVar9 + lVar21;
    puVar17 = peVar8[2].field_12.decode_to_ptr;
    puVar19 = (peVar8->field_12).decode_to_ptr;
    puVar20 = peVar8[1].field_12.decode_to_ptr;
    iVar5 = peVar8[2].user_line_stride;
    iVar6 = peVar8[1].user_line_stride;
    iVar7 = peVar8->user_line_stride;
    lVar14 = lVar21 + (long)(int)uVar1 * 2 + (long)pvVar9;
    lVar21 = lVar21 + (long)(int)uVar1 * 4 + (long)pvVar9;
    uVar18 = (ulong)uVar1;
    do {
      if (0 < (int)uVar1) {
        uVar11 = 0;
        puVar13 = puVar19;
        do {
          *(undefined2 *)puVar13 = *(undefined2 *)(lVar16 + uVar11 * 2);
          uVar11 = uVar11 + 1;
          puVar13 = puVar13 + iVar4;
        } while (uVar18 != uVar11);
      }
      if (0 < (int)uVar1) {
        uVar11 = 0;
        puVar13 = puVar20;
        do {
          *(undefined2 *)puVar13 = *(undefined2 *)(lVar14 + uVar11 * 2);
          uVar11 = uVar11 + 1;
          puVar13 = puVar13 + iVar3;
        } while (uVar18 != uVar11);
      }
      if (0 < (int)uVar1) {
        uVar11 = 0;
        puVar13 = puVar17;
        do {
          *(undefined2 *)puVar13 = *(undefined2 *)(lVar21 + uVar11 * 2);
          uVar11 = uVar11 + 1;
          puVar13 = puVar13 + iVar2;
        } while (uVar18 != uVar11);
      }
      lVar16 = lVar16 + lVar15;
      puVar19 = puVar19 + iVar7;
      puVar20 = puVar20 + iVar6;
      puVar17 = puVar17 + iVar5;
      iVar12 = iVar12 + 1;
      lVar14 = lVar14 + lVar15;
      lVar21 = lVar21 + lVar15;
    } while (iVar12 < iVar10);
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_16bit_3chan (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t*  srcbuffer = decode->unpacked_buffer;
    const uint16_t *in0, *in1, *in2;
    uint8_t *       out0, *out1, *out2;
    int             w, h;
    int             inc0, inc1, inc2;
    int             linc0, linc1, linc2;

    w     = decode->channels[0].width;
    h     = decode->chunk.height - decode->user_line_end_ignore;
    inc0  = decode->channels[0].user_pixel_stride;
    inc1  = decode->channels[1].user_pixel_stride;
    inc2  = decode->channels[2].user_pixel_stride;
    linc0 = decode->channels[0].user_line_stride;
    linc1 = decode->channels[1].user_line_stride;
    linc2 = decode->channels[2].user_line_stride;

    out0 = decode->channels[0].decode_to_ptr;
    out1 = decode->channels[1].decode_to_ptr;
    out2 = decode->channels[2].decode_to_ptr;

    /*
     * not actually using y in the loop, so just pre-increment
     * the srcbuffer for any skip
     */
    srcbuffer += decode->user_line_begin_skip * w * 6;

    for (int y = decode->user_line_begin_skip; y < h; ++y)
    {
        in0 = (const uint16_t*) srcbuffer;
        in1 = in0 + w;
        in2 = in1 + w;
        srcbuffer += w * 6; // 3 * sizeof(uint16_t), avoid type conversion
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out0 + x * inc0)) = one_to_native16 (in0[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out1 + x * inc1)) = one_to_native16 (in1[x]);
        for (int x = 0; x < w; ++x)
            *((uint16_t*) (out2 + x * inc2)) = one_to_native16 (in2[x]);
        out0 += linc0;
        out1 += linc1;
        out2 += linc2;
    }

    return EXR_ERR_SUCCESS;
}